

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ExprNode * __thiscall Parser::factor(Parser *this)

{
  bool bVar1;
  InfixExprNode *this_00;
  ExprNode **ppEVar2;
  ExprNode *pEVar3;
  bool local_462;
  Token local_400;
  ExprNode *local_390;
  ExprNode *a;
  string local_318;
  undefined1 local_2f1;
  Token local_2f0;
  undefined1 local_280 [8];
  Token check;
  ExprNode *f;
  Token local_1f8;
  undefined1 local_188 [8];
  Token t;
  Token local_110;
  InfixExprNode *local_a0;
  InfixExprNode *negativeNumber;
  undefined1 local_88 [8];
  Token op;
  Parser *this_local;
  
  op._string.field_2._8_8_ = this;
  Tokenizer::getToken((Token *)local_88,this->tokenizer);
  bVar1 = Token::isSubtractionOperator((Token *)local_88);
  if (bVar1) {
    this_00 = (InfixExprNode *)operator_new(0x90);
    t._string.field_2._M_local_buf[0xf] = '\x01';
    Token::Token(&local_110,(Token *)local_88);
    InfixExprNode::InfixExprNode(this_00,&local_110);
    t._string.field_2._M_local_buf[0xf] = '\0';
    Token::~Token(&local_110);
    local_a0 = this_00;
    Token::Token((Token *)local_188);
    Token::setWholeNumber((Token *)local_188,0.0);
    pEVar3 = (ExprNode *)operator_new(0x80);
    Token::Token(&local_1f8,(Token *)local_188);
    WholeNumber::WholeNumber((WholeNumber *)pEVar3,&local_1f8);
    ppEVar2 = InfixExprNode::left(local_a0);
    *ppEVar2 = pEVar3;
    Token::~Token(&local_1f8);
    pEVar3 = factor(this);
    ppEVar2 = InfixExprNode::right(local_a0);
    *ppEVar2 = pEVar3;
    this_local = (Parser *)local_a0;
    check._string.field_2._12_4_ = 1;
    Token::~Token((Token *)local_188);
  }
  else {
    Tokenizer::getToken((Token *)local_280,this->tokenizer);
    Tokenizer::ungetToken(this->tokenizer);
    bVar1 = Token::isOpenBrace((Token *)local_280);
    if (bVar1) {
      this_local = (Parser *)operator_new(0x88);
      local_2f1 = 1;
      Token::Token(&local_2f0,(Token *)local_88);
      pEVar3 = sub(this);
      SubExpr::SubExpr((SubExpr *)this_local,&local_2f0,pEVar3);
      local_2f1 = 0;
      Token::~Token(&local_2f0);
    }
    else {
      Token::getName_abi_cxx11_(&local_318,(Token *)local_88);
      bVar1 = std::operator==(&local_318,"len");
      local_462 = false;
      if (bVar1) {
        local_462 = Token::isOpenParen((Token *)local_280);
      }
      std::__cxx11::string::~string((string *)&local_318);
      if (local_462 == false) {
        bVar1 = Token::isOpenParen((Token *)local_280);
        if ((bVar1) && (bVar1 = Token::isName((Token *)local_88), bVar1)) {
          Token::Token((Token *)&a,(Token *)local_88);
          this_local = (Parser *)call(this,(Token *)&a);
          Token::~Token((Token *)&a);
        }
        else {
          Token::Token(&local_400,(Token *)local_88);
          this_local = (Parser *)atom(this,&local_400);
          Token::~Token(&local_400);
          local_390 = (ExprNode *)this_local;
        }
      }
      else {
        this_local = (Parser *)len(this);
      }
    }
    check._string.field_2._12_4_ = 1;
    Token::~Token((Token *)local_280);
  }
  Token::~Token((Token *)local_88);
  return (ExprNode *)this_local;
}

Assistant:

ExprNode *Parser::factor() {
    // factor: { - } factor | atom

    Token op = tokenizer.getToken();
    if(op.isSubtractionOperator()){
        auto* negativeNumber = new InfixExprNode(op);
        Token t;
        t.setWholeNumber(0);
        negativeNumber->left() = new WholeNumber(t);
        ExprNode* f = factor();
        negativeNumber->right() = f;
        return negativeNumber;
    } else{ //if(op.isName()) {
        //tokenizer.ungetToken();
        Token check = tokenizer.getToken();
        tokenizer.ungetToken();
        if(check.isOpenBrace()) {//subscription
            return new SubExpr(op,sub()); //ID[test]
        }else if(op.getName() == "len"
        && check.isOpenParen()){
            return len();
        }else if(check.isOpenParen() && op.isName()){// cal
            return call(op);
        }else {
            ExprNode *a = atom(op);
            return a;
        }

    }
}